

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass2_strategy.c
# Opt level: O1

int detect_flash(TWO_PASS *twopass,TWO_PASS_FRAME *twopass_frame,int offset)

{
  double dVar1;
  uint uVar2;
  FIRSTPASS_STATS *pFVar3;
  
  if (((offset < 0) ||
      (twopass_frame->stats_in + (uint)offset < twopass->stats_buf_ctx->stats_in_end)) &&
     ((-1 < offset || (twopass->stats_buf_ctx->stats_in_start <= twopass_frame->stats_in + offset)))
     ) {
    pFVar3 = twopass_frame->stats_in + offset;
  }
  else {
    pFVar3 = (FIRSTPASS_STATS *)0x0;
  }
  uVar2 = 0;
  if ((pFVar3 != (FIRSTPASS_STATS *)0x0) &&
     (dVar1 = pFVar3->pcnt_second_ref, pFVar3->pcnt_inter <= dVar1 && dVar1 != pFVar3->pcnt_inter))
  {
    uVar2 = (uint)(0.5 <= dVar1);
  }
  return uVar2;
}

Assistant:

static const FIRSTPASS_STATS *read_frame_stats(const TWO_PASS *p,
                                               const TWO_PASS_FRAME *p_frame,
                                               int offset) {
  if ((offset >= 0 &&
       p_frame->stats_in + offset >= p->stats_buf_ctx->stats_in_end) ||
      (offset < 0 &&
       p_frame->stats_in + offset < p->stats_buf_ctx->stats_in_start)) {
    return NULL;
  }

  return &p_frame->stats_in[offset];
}